

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSet.cpp
# Opt level: O0

void __thiscall DataSet::toFile(DataSet *this,string *file_name)

{
  byte bVar1;
  size_t sVar2;
  runtime_error *this_00;
  string *in_RSI;
  ulong *in_RDI;
  size_t f;
  size_t v;
  size_t s;
  ofstream file;
  size_t in_stack_fffffffffffffd88;
  DataSet *in_stack_fffffffffffffd90;
  ulong local_238;
  ulong local_230;
  size_t local_228 [3];
  char local_210 [528];
  
  std::ofstream::ofstream(local_210,in_RSI,_S_bin);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Could not write to file.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ostream::write(local_210,(long)in_RDI);
  local_228[0] = size((DataSet *)0x106959);
  std::ostream::write(local_210,(long)local_228);
  local_230 = 0;
  while( true ) {
    sVar2 = size((DataSet *)0x10699d);
    if (sVar2 <= local_230) break;
    for (local_238 = 0; local_238 < *in_RDI; local_238 = local_238 + 1) {
      vector(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      in_stack_fffffffffffffd90 =
           (DataSet *)
           FeatureVec::operator[]((FeatureVec *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88)
      ;
      std::ostream::write(local_210,(long)in_stack_fffffffffffffd90);
    }
    local_230 = local_230 + 1;
  }
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void DataSet::toFile(std::string file_name) {
  // Open the file
  std::ofstream file(file_name, std::ios::binary);

  if (file.good()) {
    // Write number of features
    file.write((char *) &num_features, sizeof(size_t));
    // Write size
    auto s = size();
    file.write((char *) &s, sizeof(size_t));

    // Write vectors
    for (size_t v = 0; v < size(); v++) {
      for (size_t f = 0; f < num_features; f++) {
        file.write((char *) &vector(v)[f], sizeof(float));
      }
    }
  } else {
    throw std::runtime_error("Could not write to file.");
  }
}